

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

void common_sampler_accept(common_sampler *gsmpl,llama_token token,bool accept_grammar)

{
  byte in_DL;
  undefined4 in_ESI;
  int *in_RDI;
  ring_buffer<int> *unaff_retaddr;
  
  if ((in_DL & 1) != 0) {
    llama_sampler_accept(*(undefined8 *)(in_RDI + 0x48),in_ESI);
  }
  llama_sampler_accept(*(undefined8 *)(in_RDI + 0x4a),in_ESI);
  ring_buffer<int>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void common_sampler_accept(struct common_sampler * gsmpl, llama_token token, bool accept_grammar) {
    if (accept_grammar) {
        llama_sampler_accept(gsmpl->grmr, token);
    }

    llama_sampler_accept(gsmpl->chain, token);

    gsmpl->prev.push_back(token);
}